

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_scopearrayinner_t *
ztast_scopearrayinner_append(ztast_t *ast,ztast_scopearrayinner_t *inner,ztast_scope_t *scope)

{
  int iVar1;
  ztast_scope **__dest;
  ztast_scope *in_RDX;
  ztast_scopearrayinner_t *in_RSI;
  long in_RDI;
  ztast_scope_t **newarr;
  int newarrlen;
  int local_34;
  ztast_scopearrayinner_t *local_18;
  
  local_18 = in_RSI;
  if (in_RSI == (ztast_scopearrayinner_t *)0x0) {
    local_18 = (ztast_scopearrayinner_t *)
               (**(code **)(in_RDI + 8))(0x10,*(undefined8 *)(in_RDI + 0x18));
    if (local_18 == (ztast_scopearrayinner_t *)0x0) {
      return (ztast_scopearrayinner_t *)0x0;
    }
    local_18->nused = 0;
    local_18->nallocated = 0;
    local_18->scopes = (ztast_scope **)0x0;
  }
  if (local_18->nused == local_18->nallocated) {
    if (local_18->nallocated < 8) {
      local_34 = 8;
    }
    else {
      local_34 = local_18->nallocated << 1;
    }
    __dest = (ztast_scope **)
             (**(code **)(in_RDI + 8))((long)local_34 << 3,*(undefined8 *)(in_RDI + 0x18));
    if (__dest == (ztast_scope **)0x0) {
      return (ztast_scopearrayinner_t *)0x0;
    }
    memcpy(__dest,local_18->scopes,(long)local_18->nallocated << 3);
    if (*(long *)(in_RDI + 0x10) != 0) {
      (**(code **)(in_RDI + 0x10))(local_18->scopes,*(undefined8 *)(in_RDI + 0x18));
    }
    local_18->nallocated = local_34;
    local_18->scopes = __dest;
  }
  iVar1 = local_18->nused;
  local_18->nused = iVar1 + 1;
  local_18->scopes[iVar1] = in_RDX;
  return local_18;
}

Assistant:

ztast_scopearrayinner_t *ztast_scopearrayinner_append(ztast_t                 *ast,
                                                      ztast_scopearrayinner_t *inner,
                                                      ztast_scope_t           *scope)
{
  assert(ast);
  /* inner may be NULL - which means allocate */
  assert(scope);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scopearrayinner_append\n");
#endif

  if (inner == NULL)
  {
    inner = ZTAST_MALLOC(sizeof(*inner));
    if (inner == NULL)
      return NULL;

    inner->nused      = 0;
    inner->nallocated = 0;
    inner->scopes     = NULL;
  }

  if (inner->nused == inner->nallocated)
  {
    int             newarrlen;
    ztast_scope_t **newarr;

    /* This code pattern would use realloc() normally but our simple memory
     * manager doesn't currently feature it. */

    newarrlen = inner->nallocated < 8 ? 8 : inner->nallocated * 2;
    newarr = ZTAST_MALLOC(newarrlen * sizeof(*newarr));
    if (newarr == NULL)
      return NULL;
 
    memcpy(newarr, inner->scopes, inner->nallocated * sizeof(*newarr));
    ZTAST_FREE(inner->scopes);

    inner->nallocated = newarrlen;
    inner->scopes     = newarr;
  }

  inner->scopes[inner->nused++] = scope;

  return inner;
}